

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpush.c
# Opt level: O3

int nn_xpush_add(nn_sockbase *self,nn_pipe *pipe)

{
  int increment;
  int extraout_EAX;
  nn_lb_data *pnVar1;
  nn_pipe *self_00;
  nn_sockbase *self_01;
  int sndprio;
  size_t sz;
  int local_24;
  size_t local_20;
  
  local_20 = 4;
  self_00 = (nn_pipe *)0x0;
  self_01 = (nn_sockbase *)pipe;
  nn_pipe_getopt(pipe,0,8,&local_24,&local_20);
  if (local_20 == 4) {
    if (0xffffffef < local_24 - 0x11U) {
      self_01 = (nn_sockbase *)0x20;
      pnVar1 = (nn_lb_data *)nn_alloc_(0x20);
      if (pnVar1 != (nn_lb_data *)0x0) {
        nn_pipe_setdata(pipe,pnVar1);
        nn_lb_add((nn_lb *)(self + 1),pnVar1,pipe,local_24);
        return 0;
      }
      goto LAB_00124f07;
    }
  }
  else {
    nn_xpush_add_cold_1();
  }
  nn_xpush_add_cold_3();
LAB_00124f07:
  nn_xpush_add_cold_2();
  pnVar1 = (nn_lb_data *)nn_pipe_getdata(self_00);
  nn_lb_rm((nn_lb *)(self_01 + 1),pnVar1);
  nn_free(pnVar1);
  increment = nn_lb_get_priority((nn_lb *)(self_01 + 1));
  nn_sockbase_stat_increment(self_01,0x191,increment);
  return extraout_EAX;
}

Assistant:

static int nn_xpush_add (struct nn_sockbase *self, struct nn_pipe *pipe)
{
    struct nn_xpush *xpush;
    struct nn_xpush_data *data;
    int sndprio;
    size_t sz;

    xpush = nn_cont (self, struct nn_xpush, sockbase);

    sz = sizeof (sndprio);
    nn_pipe_getopt (pipe, NN_SOL_SOCKET, NN_SNDPRIO, &sndprio, &sz);
    nn_assert (sz == sizeof (sndprio));
    nn_assert (sndprio >= 1 && sndprio <= 16);

    data = nn_alloc (sizeof (struct nn_xpush_data), "pipe data (push)");
    alloc_assert (data);
    nn_pipe_setdata (pipe, data);
    nn_lb_add (&xpush->lb, &data->lb, pipe, sndprio);

    return 0;
}